

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.c
# Opt level: O3

int handle_connection(int sockfd,ptls_context_t *ctx,char *server_name,char *input_file,
                     ptls_handshake_properties_t *hsprop,int request_key_update,int keep_sender_open
                     )

{
  ptls_early_data_acceptance_t pVar1;
  ulong *puVar2;
  size_t sVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ptls_t *tls;
  size_t sVar7;
  int *piVar8;
  ssize_t sVar9;
  ulong uVar10;
  void *input;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint8_t wbuf_small [32];
  timeval timeout;
  fd_set exceptfds;
  fd_set readfds;
  fd_set writefds;
  char bytebuf [16384];
  uint local_42b4;
  uint local_42b0;
  uint local_42ac;
  ptls_buffer_t local_4288;
  ptls_buffer_t local_4268;
  ulong local_4248;
  ulong local_4240;
  long local_4238;
  ulong local_4230;
  int local_4224;
  ulong local_4220;
  ptls_buffer_t local_4218;
  uint64_t local_41f8;
  char *local_41f0;
  size_t local_41e8 [4];
  timeval local_41c8;
  fd_set local_41b8;
  fd_set local_4138;
  fd_set local_40b8;
  ptls_buffer_t local_4038 [512];
  
  uVar13 = (ulong)(uint)sockfd;
  local_4224 = request_key_update;
  if (server_name == (char *)0x0) {
    tls = ptls_server_new(ctx);
  }
  else {
    tls = ptls_client_new(ctx);
  }
  local_41f8 = (*ctx->get_time->cb)(ctx->get_time);
  local_4218.base = "";
  local_4218.capacity = 0;
  local_4218.off = 0;
  local_42b4 = 0;
  local_4218._24_8_ = (ulong)(uint)local_4218._28_4_ << 0x20;
  local_4268.base = "";
  local_4268.capacity = 0;
  local_4268.off = 0;
  local_4268._24_8_ = (ulong)(uint)local_4268._28_4_ << 0x20;
  local_4288.base = "";
  local_4288.capacity = 0;
  local_4288.off = 0;
  local_4288._24_8_ = (ulong)(uint)local_4288._28_4_ << 0x20;
  fcntl(sockfd,4,0x800);
  if (input_file == "is:benchmark") {
    iVar5 = ptls_is_server(tls);
    local_42b4 = (uint)(iVar5 != 0) * 2 - 2;
  }
  else if ((input_file != (char *)0x0) &&
          (local_42b4 = open(input_file,0), local_42b4 == 0xffffffff)) {
    handle_connection_cold_1();
    local_42ac = 1;
    local_42b4 = 0xffffffff;
    goto LAB_0010792d;
  }
  local_42ac = 0;
  if (server_name != (char *)0x0) {
    ptls_set_server_name(tls,server_name,0);
    uVar4 = ptls_handshake(tls,&local_4268,(void *)0x0,(size_t *)0x0,hsprop);
    local_42ac = 0x202;
    if (uVar4 != 0x202) {
      local_4238 = 0;
      fprintf(_stderr,"ptls_handshake:%d\n",(ulong)uVar4);
      local_42ac = 1;
LAB_0010791a:
      if (input_file == "is:benchmark") {
        handle_connection_cold_3();
      }
LAB_0010792d:
      if (sockfd != -1) {
        close(sockfd);
      }
      if (((input_file != (char *)0x0) && (input_file != "is:benchmark")) && (-1 < (int)local_42b4))
      {
        close(local_42b4);
      }
      ptls_buffer__release_memory(&local_4218);
      local_4218.off = 0;
      local_4218.is_allocated = 0;
      local_4218._28_4_ = 0;
      local_4218.base = (uint8_t *)0x0;
      local_4218.capacity = 0;
      ptls_buffer__release_memory(&local_4268);
      local_4268.off = 0;
      local_4268.is_allocated = 0;
      local_4268._28_4_ = 0;
      local_4268.base = (uint8_t *)0x0;
      local_4268.capacity = 0;
      ptls_buffer__release_memory(&local_4288);
      local_4288.off = 0;
      local_4288.is_allocated = 0;
      local_4288._28_4_ = 0;
      local_4288.base = (uint8_t *)0x0;
      local_4288.capacity = 0;
      ptls_free(tls);
      return (int)(local_42ac != 0);
    }
  }
  iVar5 = sockfd + 0x3f;
  if (-1 < sockfd) {
    iVar5 = sockfd;
  }
  uVar14 = 1L << ((byte)sockfd & 0x3f);
  iVar5 = iVar5 >> 6;
  local_4238 = 0;
  local_4240 = 0;
  local_42b0 = 0;
  local_4248 = uVar13;
  local_41f0 = server_name;
LAB_0010724a:
  uVar15 = 1L << ((byte)local_42b4 & 0x3f);
  local_4220 = (ulong)(local_42b4 >> 6);
  sockfd = (int)uVar13;
  uVar11 = uVar13 & 0xffffffff;
  if (sockfd < (int)local_42b4) {
    uVar11 = (ulong)local_42b4;
  }
  do {
    local_4138.fds_bits[0xe] = 0;
    local_4138.fds_bits[0xf] = 0;
    local_4138.fds_bits[0xc] = 0;
    local_4138.fds_bits[0xd] = 0;
    local_4138.fds_bits[10] = 0;
    local_4138.fds_bits[0xb] = 0;
    local_4138.fds_bits[8] = 0;
    local_4138.fds_bits[9] = 0;
    local_4138.fds_bits[6] = 0;
    local_4138.fds_bits[7] = 0;
    local_4138.fds_bits[4] = 0;
    local_4138.fds_bits[5] = 0;
    local_4138.fds_bits[2] = 0;
    local_4138.fds_bits[3] = 0;
    local_4138.fds_bits[0] = 0;
    local_4138.fds_bits[1] = 0;
    local_40b8.fds_bits[0] = 0;
    local_40b8.fds_bits[1] = 0;
    local_40b8.fds_bits[2] = 0;
    local_40b8.fds_bits[3] = 0;
    local_40b8.fds_bits[4] = 0;
    local_40b8.fds_bits[5] = 0;
    local_40b8.fds_bits[6] = 0;
    local_40b8.fds_bits[7] = 0;
    local_40b8.fds_bits[8] = 0;
    local_40b8.fds_bits[9] = 0;
    local_40b8.fds_bits[10] = 0;
    local_40b8.fds_bits[0xb] = 0;
    local_40b8.fds_bits[0xc] = 0;
    local_40b8.fds_bits[0xd] = 0;
    local_40b8.fds_bits[0xe] = 0;
    local_40b8.fds_bits[0xf] = 0;
    local_41b8.fds_bits[0] = 0;
    local_41b8.fds_bits[1] = 0;
    local_41b8.fds_bits[2] = 0;
    local_41b8.fds_bits[3] = 0;
    local_41b8.fds_bits[4] = 0;
    local_41b8.fds_bits[5] = 0;
    local_41b8.fds_bits[6] = 0;
    local_41b8.fds_bits[7] = 0;
    local_41b8.fds_bits[8] = 0;
    local_41b8.fds_bits[9] = 0;
    local_41b8.fds_bits[10] = 0;
    local_41b8.fds_bits[0xb] = 0;
    local_4138.fds_bits[iVar5] = local_4138.fds_bits[iVar5] | uVar14;
    local_41b8.fds_bits[0xc] = 0;
    local_41b8.fds_bits[0xd] = 0;
    local_41b8.fds_bits[0xe] = 0;
    local_41b8.fds_bits[0xf] = 0;
    if ((local_4268.off != 0) || (local_42b4 == 0xfffffffe)) {
      local_40b8.fds_bits[iVar5] = local_40b8.fds_bits[iVar5] | uVar14;
    }
    local_41b8.fds_bits[iVar5] = local_41b8.fds_bits[iVar5] | uVar14;
    iVar6 = sockfd;
    if (-1 < (int)local_42b4) {
      uVar10 = (ulong)(uint)((int)local_4220 * 8);
      puVar2 = (ulong *)((long)local_4138.fds_bits + uVar10);
      *puVar2 = *puVar2 | uVar15;
      puVar2 = (ulong *)((long)local_41b8.fds_bits + uVar10);
      *puVar2 = *puVar2 | uVar15;
      iVar6 = (int)uVar11;
    }
    local_41c8.tv_sec = 0;
    if (local_4268.off == 0) {
      local_41c8.tv_sec = 0xe10;
    }
    local_41c8.tv_usec = 0;
    iVar6 = select(iVar6 + 1,&local_4138,&local_40b8,&local_41b8,&local_41c8);
  } while (iVar6 == -1);
  if (((local_4138.fds_bits[iVar5] & uVar14) == 0) && ((local_41b8.fds_bits[iVar5] & uVar14) == 0))
  goto LAB_001075b0;
  do {
    sVar7 = read(sockfd,local_4038,0x4000);
    if (sVar7 != 0xffffffffffffffff) {
      if ((long)sVar7 < 1) goto LAB_0010791a;
      lVar12 = 0;
      local_4230 = uVar15;
      local_41e8[0] = sVar7;
      goto LAB_00107453;
    }
    piVar8 = __errno_location();
  } while (*piVar8 == 4);
  uVar13 = local_4248;
  if (*piVar8 != 0xb) goto LAB_0010791a;
  goto LAB_001075b0;
LAB_00107453:
  do {
    input = (void *)((long)&local_4038[0].base + lVar12);
    if (local_42b0 == 0) {
      local_42ac = ptls_handshake(tls,&local_4268,input,local_41e8,hsprop);
      local_42b0 = 0;
      if (local_42ac != 0x202) {
        if (local_42ac != 0) {
          sockfd = (int)local_4248;
          handle_connection_cold_2();
          goto LAB_0010791a;
        }
        iVar6 = ptls_is_server(tls);
        pVar1 = (hsprop->field_0).client.early_data_acceptance;
        if (iVar6 == 0 && pVar1 == PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN) {
          __assert_fail("ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/cli.c"
                        ,0x95,
                        "int handle_connection(int, ptls_context_t *, const char *, const char *, ptls_handshake_properties_t *, int, int)"
                       );
        }
        if (pVar1 == PTLS_EARLY_DATA_ACCEPTED) {
          shift_buffer(&local_4288,local_4240);
        }
        local_42ac = 0;
        if (local_4224 == 0) {
          local_42b0 = 1;
        }
        else {
          ptls_update_key(tls,1);
          local_42b0 = 1;
          local_42ac = 0;
        }
      }
    }
    else {
      local_42ac = ptls_receive(tls,&local_4218,input,local_41e8);
      sVar3 = local_4218.off;
      uVar15 = local_4230;
      if (local_42ac != 0x202) {
        if (local_42ac != 0) {
          fprintf(_stderr,"ptls_receive:%d\n",(ulong)local_42ac);
          sockfd = (int)local_4248;
          goto LAB_0010791a;
        }
        if (local_4218.off != 0) {
          if (input_file != "is:benchmark") {
            write(1,local_4218.base,local_4218.off);
          }
          local_4238 = local_4238 + sVar3;
          local_4218.off = 0;
        }
        local_42ac = 0;
        uVar15 = local_4230;
      }
    }
    lVar12 = lVar12 + local_41e8[0];
    local_41e8[0] = sVar7 - lVar12;
    uVar13 = local_4248;
  } while (local_41e8[0] != 0);
LAB_001075b0:
  sockfd = (int)uVar13;
  if ((local_4268.off == 0) || (local_42b0 == 0)) {
    if (-1 < (int)local_42b4) {
      if (((local_4138.fds_bits[local_4220] & uVar15) != 0) ||
         ((local_41b8.fds_bits[local_4220] & uVar15) != 0)) {
        local_42ac = ptls_buffer_reserve(&local_4288,0x4000);
        if (local_42ac != 0) goto LAB_0010791a;
        do {
          sVar9 = read(local_42b4,local_4288.base + local_4288.off,0x4000);
          if (sVar9 != -1) {
            if (sVar9 < 1) {
              if (sVar9 == 0 && input_file != (char *)0x0) {
                close(local_42b4);
                local_42b4 = 0xffffffff;
              }
              else {
                local_42b4 = local_42b4 | -(uint)(sVar9 == 0);
              }
              local_42ac = 0;
            }
            else {
              local_4288.off = sVar9 + local_4288.off;
              local_42ac = 0;
            }
            goto LAB_00107703;
          }
          piVar8 = __errno_location();
        } while (*piVar8 == 4);
        local_42ac = 0;
      }
      goto LAB_00107703;
    }
    if (local_42b4 != 0xfffffffe) goto LAB_00107703;
    if (local_4288.capacity < 0x4000) {
      local_42ac = ptls_buffer_reserve(&local_4288,0x4000 - local_4288.capacity);
      if (local_42ac != 0) {
        local_42b4 = 0xfffffffe;
        goto LAB_0010791a;
      }
      memset(local_4288.base + local_4288.capacity,0,0x4000 - local_4288.capacity);
      local_42ac = 0;
    }
    local_4288.off = 0x4000;
    local_42b4 = 0xfffffffe;
  }
  else {
LAB_00107703:
    if (local_4288.off == 0) goto LAB_00107785;
  }
  if (local_42b0 == 0) {
    if ((local_41f0 == (char *)0x0) ||
       (puVar2 = (hsprop->field_0).client.max_early_data_size, puVar2 == (ulong *)0x0))
    goto LAB_00107785;
    uVar15 = *puVar2;
    sVar7 = local_4288.off;
    if (uVar15 < local_4288.off) {
      sVar7 = uVar15;
    }
    if (sVar7 - local_4240 == 0) goto LAB_00107785;
    local_42ac = ptls_send(tls,&local_4268,local_4288.base,sVar7 - local_4240);
    if (local_42ac != 0) {
      fprintf(_stderr,"ptls_send(early_data):%d\n",(ulong)local_42ac);
      goto LAB_0010791a;
    }
  }
  else {
    local_42ac = ptls_send(tls,&local_4268,local_4288.base,local_4288.off);
    if (local_42ac != 0) {
      fprintf(_stderr,"ptls_send(1rtt):%d\n");
      goto LAB_0010791a;
    }
    local_4288.off = 0;
    sVar7 = local_4240;
  }
  local_4240 = sVar7;
  local_42ac = 0;
LAB_00107785:
  if (local_4268.off != 0) {
    do {
      sVar7 = write(sockfd,local_4268.base,local_4268.off);
      if (sVar7 != 0xffffffffffffffff) {
        if ((long)sVar7 < 1) goto LAB_0010791a;
        shift_buffer(&local_4268,sVar7);
        goto LAB_001077d8;
      }
      piVar8 = __errno_location();
    } while (*piVar8 == 4);
    if (*piVar8 != 0xb) goto LAB_0010791a;
  }
LAB_001077d8:
  uVar4 = local_42b0 ^ 1;
  if (local_42b4 == 0xffffffff && uVar4 == 0) {
    local_42b0 = 2;
  }
  if ((local_42b4 == 0xffffffff && uVar4 == 0) && keep_sender_open == 0) {
    local_4038[0].base = (uint8_t *)local_41e8;
    local_4038[0].off = 0;
    local_4038[0].capacity = 0x20;
    local_4038[0]._24_8_ = local_4038[0]._24_8_ & 0xffffffff00000000;
    local_42ac = ptls_send_alert(tls,local_4038,'\x01','\0');
    if (local_42ac != 0) {
      fprintf(_stderr,"ptls_send_alert:%d\n",(ulong)local_42ac);
    }
    if (local_4038[0].off != 0) {
      write(sockfd,local_4038[0].base,local_4038[0].off);
    }
    ptls_buffer__release_memory(local_4038);
    local_4038[0].off = 0;
    local_4038[0]._24_8_ = 0;
    local_4038[0].base = (uint8_t *)0x0;
    local_4038[0].capacity = 0;
    shutdown(sockfd,1);
    local_42b0 = 2;
  }
  goto LAB_0010724a;
}

Assistant:

static int handle_connection(int sockfd, ptls_context_t *ctx, const char *server_name, const char *input_file,
                             ptls_handshake_properties_t *hsprop, int request_key_update, int keep_sender_open)
{
    static const int inputfd_is_benchmark = -2;

    ptls_t *tls = ptls_new(ctx, server_name == NULL);
    ptls_buffer_t rbuf, encbuf, ptbuf;
    enum { IN_HANDSHAKE, IN_1RTT, IN_SHUTDOWN } state = IN_HANDSHAKE;
    int inputfd = 0, ret = 0;
    size_t early_bytes_sent = 0;
    uint64_t data_received = 0;
    ssize_t ioret;

    uint64_t start_at = ctx->get_time->cb(ctx->get_time);

    ptls_buffer_init(&rbuf, "", 0);
    ptls_buffer_init(&encbuf, "", 0);
    ptls_buffer_init(&ptbuf, "", 0);

    fcntl(sockfd, F_SETFL, O_NONBLOCK);

    if (input_file == input_file_is_benchmark) {
        if (!ptls_is_server(tls))
            inputfd = inputfd_is_benchmark;
    } else if (input_file != NULL) {
        if ((inputfd = open(input_file, O_RDONLY)) == -1) {
            fprintf(stderr, "failed to open file:%s:%s\n", input_file, strerror(errno));
            ret = 1;
            goto Exit;
        }
    }
    if (server_name != NULL) {
        ptls_set_server_name(tls, server_name, 0);
        if ((ret = ptls_handshake(tls, &encbuf, NULL, NULL, hsprop)) != PTLS_ERROR_IN_PROGRESS) {
            fprintf(stderr, "ptls_handshake:%d\n", ret);
            ret = 1;
            goto Exit;
        }
    }

    while (1) {
        /* check if data is available */
        fd_set readfds, writefds, exceptfds;
        int maxfd = 0;
        struct timeval timeout;
        do {
            FD_ZERO(&readfds);
            FD_ZERO(&writefds);
            FD_ZERO(&exceptfds);
            FD_SET(sockfd, &readfds);
            if (encbuf.off != 0 || inputfd == inputfd_is_benchmark)
                FD_SET(sockfd, &writefds);
            FD_SET(sockfd, &exceptfds);
            maxfd = sockfd + 1;
            if (inputfd >= 0) {
                FD_SET(inputfd, &readfds);
                FD_SET(inputfd, &exceptfds);
                if (maxfd <= inputfd)
                    maxfd = inputfd + 1;
            }
            timeout.tv_sec = encbuf.off != 0 ? 0 : 3600;
            timeout.tv_usec = 0;
        } while (select(maxfd, &readfds, &writefds, &exceptfds, &timeout) == -1);

        /* consume incoming messages */
        if (FD_ISSET(sockfd, &readfds) || FD_ISSET(sockfd, &exceptfds)) {
            char bytebuf[16384];
            size_t off = 0, leftlen;
            while ((ioret = read(sockfd, bytebuf, sizeof(bytebuf))) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
                ioret = 0;
            } else if (ioret <= 0) {
                goto Exit;
            }
            while ((leftlen = ioret - off) != 0) {
                if (state == IN_HANDSHAKE) {
                    if ((ret = ptls_handshake(tls, &encbuf, bytebuf + off, &leftlen, hsprop)) == 0) {
                        state = IN_1RTT;
                        assert(ptls_is_server(tls) || hsprop->client.early_data_acceptance != PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN);
                        /* release data sent as early-data, if server accepted it */
                        if (hsprop->client.early_data_acceptance == PTLS_EARLY_DATA_ACCEPTED)
                            shift_buffer(&ptbuf, early_bytes_sent);
                        if (request_key_update)
                            ptls_update_key(tls, 1);
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        if (encbuf.off != 0)
                            (void)write(sockfd, encbuf.base, encbuf.off);
                        fprintf(stderr, "ptls_handshake:%d\n", ret);
                        goto Exit;
                    }
                } else {
                    if ((ret = ptls_receive(tls, &rbuf, bytebuf + off, &leftlen)) == 0) {
                        if (rbuf.off != 0) {
                            data_received += rbuf.off;
                            if (input_file != input_file_is_benchmark)
                                write(1, rbuf.base, rbuf.off);
                            rbuf.off = 0;
                        }
                    } else if (ret == PTLS_ERROR_IN_PROGRESS) {
                        /* ok */
                    } else {
                        fprintf(stderr, "ptls_receive:%d\n", ret);
                        goto Exit;
                    }
                }
                off += leftlen;
            }
        }

        /* encrypt data to send, if any is available */
        if (encbuf.off == 0 || state == IN_HANDSHAKE) {
            static const size_t block_size = 16384;
            if (inputfd >= 0 && (FD_ISSET(inputfd, &readfds) || FD_ISSET(inputfd, &exceptfds))) {
                if ((ret = ptls_buffer_reserve(&ptbuf, block_size)) != 0)
                    goto Exit;
                while ((ioret = read(inputfd, ptbuf.base + ptbuf.off, block_size)) == -1 && errno == EINTR)
                    ;
                if (ioret > 0) {
                    ptbuf.off += ioret;
                } else if (ioret == 0) {
                    /* closed */
                    if (input_file != NULL)
                        close(inputfd);
                    inputfd = -1;
                }
            } else if (inputfd == inputfd_is_benchmark) {
                if (ptbuf.capacity < block_size) {
                    if ((ret = ptls_buffer_reserve(&ptbuf, block_size - ptbuf.capacity)) != 0)
                        goto Exit;
                    memset(ptbuf.base + ptbuf.capacity, 0, block_size - ptbuf.capacity);
                }
                ptbuf.off = block_size;
            }
        }
        if (ptbuf.off != 0) {
            if (state == IN_HANDSHAKE) {
                size_t send_amount = 0;
                if (server_name != NULL && hsprop->client.max_early_data_size != NULL) {
                    size_t max_can_be_sent = *hsprop->client.max_early_data_size;
                    if (max_can_be_sent > ptbuf.off)
                        max_can_be_sent = ptbuf.off;
                    send_amount = max_can_be_sent - early_bytes_sent;
                }
                if (send_amount != 0) {
                    if ((ret = ptls_send(tls, &encbuf, ptbuf.base, send_amount)) != 0) {
                        fprintf(stderr, "ptls_send(early_data):%d\n", ret);
                        goto Exit;
                    }
                    early_bytes_sent += send_amount;
                }
            } else {
                if ((ret = ptls_send(tls, &encbuf, ptbuf.base, ptbuf.off)) != 0) {
                    fprintf(stderr, "ptls_send(1rtt):%d\n", ret);
                    goto Exit;
                }
                ptbuf.off = 0;
            }
        }

        /* send any data */
        if (encbuf.off != 0) {
            while ((ioret = write(sockfd, encbuf.base, encbuf.off)) == -1 && errno == EINTR)
                ;
            if (ioret == -1 && (errno == EWOULDBLOCK || errno == EAGAIN)) {
                /* no data */
            } else if (ioret <= 0) {
                goto Exit;
            } else {
                shift_buffer(&encbuf, ioret);
            }
        }

        /* close the sender side when necessary */
        if (state == IN_1RTT && inputfd == -1) {
            if (!keep_sender_open) {
                ptls_buffer_t wbuf;
                uint8_t wbuf_small[32];
                ptls_buffer_init(&wbuf, wbuf_small, sizeof(wbuf_small));
                if ((ret = ptls_send_alert(tls, &wbuf, PTLS_ALERT_LEVEL_WARNING, PTLS_ALERT_CLOSE_NOTIFY)) != 0) {
                    fprintf(stderr, "ptls_send_alert:%d\n", ret);
                }
                if (wbuf.off != 0)
                    (void)write(sockfd, wbuf.base, wbuf.off);
                ptls_buffer_dispose(&wbuf);
                shutdown(sockfd, SHUT_WR);
            }
            state = IN_SHUTDOWN;
        }
    }

Exit:
    if (input_file == input_file_is_benchmark) {
        double elapsed = (ctx->get_time->cb(ctx->get_time) - start_at) / 1000.0;
        ptls_cipher_suite_t *cipher_suite = ptls_get_cipher(tls);
        fprintf(stderr, "received %" PRIu64 " bytes in %.3f seconds (%f.3Mbps); %s\n", data_received, elapsed,
                data_received * 8 / elapsed / 1000 / 1000, cipher_suite != NULL ? cipher_suite->aead->name : "unknown cipher");
    }

    if (sockfd != -1)
        close(sockfd);
    if (input_file != NULL && input_file != input_file_is_benchmark && inputfd >= 0)
        close(inputfd);
    ptls_buffer_dispose(&rbuf);
    ptls_buffer_dispose(&encbuf);
    ptls_buffer_dispose(&ptbuf);
    ptls_free(tls);

    return ret != 0;
}